

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Psbt::AddTxIn(Psbt *this,TxInReference *txin)

{
  uint32_t uVar1;
  Txid TStack_38;
  
  Txid::Txid(&TStack_38,&(txin->super_AbstractTxInReference).txid_);
  uVar1 = AddTxIn(this,&TStack_38,(txin->super_AbstractTxInReference).vout_,
                  (txin->super_AbstractTxInReference).sequence_);
  Txid::~Txid(&TStack_38);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const TxInReference &txin) {
  return AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
}